

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# preprocessor.cpp
# Opt level: O0

void __thiscall
mocker::anon_unknown_6::FindUnusedVariables::operator()(FindUnusedVariables *this,WhileStmt *node)

{
  bool bVar1;
  shared_ptr<mocker::ast::ASTNode> local_48 [2];
  shared_ptr<mocker::ast::ASTNode> local_28;
  WhileStmt *local_18;
  WhileStmt *node_local;
  FindUnusedVariables *this_local;
  
  local_18 = node;
  node_local = (WhileStmt *)this;
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&node->condition);
  if (bVar1) {
    std::shared_ptr<mocker::ast::ASTNode>::shared_ptr<mocker::ast::Expression,void>
              (&local_28,&local_18->condition);
    visit(this,&local_28);
    std::shared_ptr<mocker::ast::ASTNode>::~shared_ptr(&local_28);
  }
  std::shared_ptr<mocker::ast::ASTNode>::shared_ptr<mocker::ast::Statement,void>
            (local_48,&local_18->body);
  visit(this,local_48);
  std::shared_ptr<mocker::ast::ASTNode>::~shared_ptr(local_48);
  return;
}

Assistant:

void operator()(const ast::WhileStmt &node) const override {
    if (node.condition)
      visit(node.condition);
    visit(node.body);
  }